

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_unary_expr(gvisitor_t *self,gnode_unary_expr_t *node)

{
  long *plVar1;
  ircode_t *code_00;
  uint32_t p2;
  uint32_t p1;
  uint32_t local_5c;
  opcode_t local_40;
  opcode_t op;
  uint32_t r1;
  uint32_t r2;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_unary_expr_t *node_local;
  gvisitor_t *self_local;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar1[0x14];
    gvisit(self,node->expr);
    if (node->op != TOK_OP_ADD) {
      p2 = ircode_register_pop(code_00);
      if (p2 == 0xffffffff) {
        report_error(self,&node->base,"Invalid unary expression.");
      }
      p1 = ircode_register_push_temp(code_00);
      if (node->op == TOK_OP_SUB) {
        local_40 = NEG;
      }
      else {
        local_40 = token2opcode(node->op);
      }
      if (node == (gnode_unary_expr_t *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = (node->base).token.lineno;
      }
      ircode_add(code_00,local_40,p1,p2,0,local_5c);
    }
  }
  return;
}

Assistant:

static void visit_unary_expr (gvisitor_t *self, gnode_unary_expr_t *node) {
    DEBUG_CODEGEN("visit_unary_expr %s", token_name(node->op));
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // unary expression can be:
    //    +    Unary PLUS
    //    -    Unary MINUS
    //    !    Logical NOT
    //    ~    Bitwise NOT

    visit(node->expr);
    if (node->op == TOK_OP_ADD) {
        // +1 is just 1 and more generally +expr is just expr so ignore + and proceed
        return;
    }

    uint32_t r2 = ircode_register_pop(code);
    if (r2 == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid unary expression.");
    uint32_t r1 = ircode_register_push_temp(code);

    opcode_t op = (node->op == TOK_OP_SUB) ? NEG : token2opcode(node->op);
	ircode_add(code, op, r1, r2, 0, LINE_NUMBER(node));

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}